

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa_util.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_0::HasDescriptorDecorations(IRContext *context,Instruction *var)

{
  bool bVar1;
  uint32_t uVar2;
  DecorationManager *pDVar3;
  bool local_29;
  DecorationManager *local_28;
  DecorationManager **local_20;
  DecorationManager **decoration_mgr;
  Instruction *var_local;
  IRContext *context_local;
  
  decoration_mgr = (DecorationManager **)var;
  var_local = (Instruction *)context;
  pDVar3 = IRContext::get_decoration_mgr(context);
  local_20 = &local_28;
  local_28 = pDVar3;
  uVar2 = opt::Instruction::result_id((Instruction *)decoration_mgr);
  bVar1 = analysis::DecorationManager::HasDecoration(pDVar3,uVar2,0x22);
  local_29 = false;
  if (bVar1) {
    pDVar3 = *local_20;
    uVar2 = opt::Instruction::result_id((Instruction *)decoration_mgr);
    local_29 = analysis::DecorationManager::HasDecoration(pDVar3,uVar2,0x21);
  }
  return local_29;
}

Assistant:

bool HasDescriptorDecorations(IRContext* context, Instruction* var) {
  const auto& decoration_mgr = context->get_decoration_mgr();
  return decoration_mgr->HasDecoration(
             var->result_id(), uint32_t(spv::Decoration::DescriptorSet)) &&
         decoration_mgr->HasDecoration(var->result_id(),
                                       uint32_t(spv::Decoration::Binding));
}